

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::emit_atomic_func_op
          (CompilerMSL *this,uint32_t result_type,uint32_t result_id,char *op,Op opcode,
          uint32_t mem_order_1,uint32_t mem_order_2,bool has_mem_order_2,uint32_t obj,uint32_t op1,
          bool op1_is_pointer,bool op1_is_literal,uint32_t op2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t id;
  BaseType target_type;
  ExecutionModel EVar2;
  int iVar3;
  SPIRType *pSVar4;
  SPIRVariable *pSVar5;
  SPIRType *pSVar6;
  long *plVar7;
  SPIRType *type;
  undefined8 *puVar8;
  runtime_error *prVar9;
  size_type *psVar10;
  bool bVar11;
  _Alloc_hider _Var12;
  undefined4 in_register_00000084;
  char (*ts_2) [4];
  byte bVar13;
  bool bVar14;
  char (*in_stack_fffffffffffffdc8) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  uint32_t local_1ec;
  string exp;
  string local_1a0;
  SPIRType remapped_type;
  
  ts_2 = (char (*) [4])CONCAT44(in_register_00000084,opcode);
  exp._M_dataplus._M_p = (pointer)&exp.field_2;
  exp._M_string_length = 0;
  exp.field_2._M_local_buf[0] = '\0';
  local_1ec = result_id;
  pSVar4 = Compiler::expression_type((Compiler *)this,obj);
  pSVar4 = Compiler::get_pointee_type((Compiler *)this,pSVar4);
  if ((opcode & ~OpSourceContinued) == OpAtomicUMin) {
    target_type = to_unsigned_basetype(pSVar4->width);
  }
  else if ((opcode & ~OpSourceContinued) == OpAtomicSMin) {
    target_type = to_signed_basetype(pSVar4->width);
  }
  else {
    target_type = *(BaseType *)&(pSVar4->super_IVariant).field_0xc;
  }
  if (pSVar4->width == 0x40) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    remapped_type.super_IVariant._vptr_IVariant = (_func_int **)&remapped_type.width;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&remapped_type,"MSL currently does not support 64-bit atomics.","");
    ::std::runtime_error::runtime_error(prVar9,(string *)&remapped_type);
    *(undefined ***)prVar9 = &PTR__runtime_error_003fce08;
    __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  SPIRType::SPIRType(&remapped_type,pSVar4);
  remapped_type.super_IVariant._12_4_ = target_type;
  pSVar5 = Compiler::maybe_get_backing_variable((Compiler *)this,obj);
  if (pSVar5 == (SPIRVariable *)0x0) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,"No backing variable for atomic operation.","");
    ::std::runtime_error::runtime_error(prVar9,(string *)&local_230);
    *(undefined ***)prVar9 = &PTR__runtime_error_003fce08;
    __cxa_throw(prVar9,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  pSVar6 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(pSVar5->super_IVariant).field_0xc);
  bVar14 = op1 != 0;
  if (opcode == OpAtomicLoad) {
LAB_002cb688:
    bVar11 = false;
  }
  else {
    EVar2 = Compiler::get_execution_model((Compiler *)this);
    bVar11 = false;
    if ((EVar2 == ExecutionModelFragment) && (0x4f4b < (this->msl_options).msl_version)) {
      if (((this->msl_options).check_discarded_frag_stores != true) ||
         (this->frag_shader_needs_discard_checks != true)) goto LAB_002cb688;
      if ((pSVar6->storage != StorageClassUniformConstant) ||
         (bVar11 = true, *(int *)&(pSVar6->super_IVariant).field_0xc != 0x10)) {
        bVar11 = pSVar5->storage == StorageClassUniform ||
                 pSVar5->storage == StorageClassStorageBuffer;
      }
    }
  }
  bVar13 = bVar14 & op1_is_pointer;
  if (bVar11) {
    if (bVar13 == 0) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(&local_210,this,0x17,1);
      join<char_const(&)[3],std::__cxx11::string,char_const(&)[4]>
                (&local_230,(spirv_cross *)0x37a39e,(char (*) [3])&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37280b,ts_2)
      ;
      ::std::__cxx11::string::operator=((string *)&exp,(string *)&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
    }
    else {
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,result_type,local_1ec);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(&local_230,this,0x17,1);
      CompilerGLSL::statement<char_const(&)[6],std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [6])"if (!",&local_230,(char (*) [2])0x36641e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    }
  }
  ::std::__cxx11::string::string((string *)&local_210,op,(allocator *)&local_1a0);
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_210);
  paVar1 = &local_230.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_230.field_2._M_allocated_capacity = *psVar10;
    local_230.field_2._8_8_ = plVar7[3];
    local_230._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_230.field_2._M_allocated_capacity = *psVar10;
    local_230._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_230._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)&exp);
  if ((pSVar6->storage == StorageClassUniformConstant) &&
     (*(int *)&(pSVar6->super_IVariant).field_0xc == 0x10)) {
    ::std::__cxx11::string::append((char *)&exp);
  }
  else {
    type = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(pSVar5->super_IVariant).field_0xc);
    get_type_address_space_abi_cxx11_(&local_230,this,type,(pSVar5->super_IVariant).self.id,true);
    ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
  }
  ::std::__cxx11::string::append((char *)&exp);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
            (&local_230,this,&remapped_type,0);
  ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)&exp);
  ::std::__cxx11::string::append((char *)&exp);
  CompilerGLSL::to_enclosed_expression_abi_cxx11_(&local_230,&this->super_CompilerGLSL,obj,true);
  ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  id = op2;
  iVar3 = strcmp(op,"atomic_compare_exchange_weak_explicit");
  if (bVar13 != 0) {
    if (iVar3 != 0) {
      __assert_fail("strcmp(op, \"atomic_compare_exchange_weak_explicit\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x262f,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    if (id == 0) {
      __assert_fail("op2",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x2630,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    if (!has_mem_order_2) {
      __assert_fail("has_mem_order_2",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x2631,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    ::std::__cxx11::string::append((char *)&exp);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_230,this,(ulong)local_1ec,1);
    ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)&exp);
    CompilerGLSL::to_expression_abi_cxx11_(&local_230,&this->super_CompilerGLSL,id,true);
    ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)&exp);
    ::std::__cxx11::string::append((char *)&exp);
    ::std::__cxx11::string::append((char *)&exp);
    ::std::__cxx11::string::append((char *)&exp);
    ::std::__cxx11::string::append((char *)&exp);
    if (!bVar11) {
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,result_type,local_1ec);
    }
    CompilerGLSL::statement<char_const(&)[3]>(&this->super_CompilerGLSL,(char (*) [3])"do");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_230,this,(ulong)local_1ec,1);
    CompilerGLSL::to_expression_abi_cxx11_(&local_210,&this->super_CompilerGLSL,op1,true);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_230,(char (*) [4])0x37d8ee,&local_210,
               (char (*) [2])0x365574);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_210,this,(ulong)local_1ec,1);
    CompilerGLSL::to_enclosed_expression_abi_cxx11_(&local_1a0,&this->super_CompilerGLSL,op1,true);
    join<char_const(&)[9],std::__cxx11::string&,char_const(&)[5],std::__cxx11::string,char_const(&)[5],std::__cxx11::string,char_const(&)[2]>
              (&local_230,(spirv_cross *)"while (!",(char (*) [9])&exp,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" && ",
               (char (*) [5])&local_210,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" == ",
               (char (*) [5])&local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36641e,
               in_stack_fffffffffffffdc8);
    CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL,&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    if (bVar11) {
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[5]>(&this->super_CompilerGLSL,(char (*) [5])0x35d500);
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      ::std::__cxx11::string::_M_replace((ulong)&exp,0,(char *)exp._M_string_length,0x37a3a1);
      ::std::__cxx11::string::append((char *)&exp);
      if ((pSVar6->storage == StorageClassUniformConstant) &&
         (*(int *)&(pSVar6->super_IVariant).field_0xc == 0x10)) {
        ::std::__cxx11::string::append((char *)&exp);
      }
      else {
        pSVar4 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(pSVar5->super_IVariant).field_0xc);
        get_type_address_space_abi_cxx11_
                  (&local_230,this,pSVar4,(pSVar5->super_IVariant).self.id,true);
        ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar1) {
          operator_delete(local_230._M_dataplus._M_p);
        }
      }
      ::std::__cxx11::string::append((char *)&exp);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_230,this,&remapped_type,0);
      ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)&exp);
      ::std::__cxx11::string::append((char *)&exp);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_(&local_230,&this->super_CompilerGLSL,obj,true)
      ;
      ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,", ","");
      puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_210);
      psVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_230.field_2._M_allocated_capacity = *psVar10;
        local_230.field_2._8_8_ = puVar8[3];
        local_230._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_230.field_2._M_allocated_capacity = *psVar10;
        local_230._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_230._M_string_length = puVar8[1];
      *puVar8 = psVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)&exp);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (&local_230,this,(ulong)local_1ec,1);
      CompilerGLSL::
      statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,&local_230,(char (*) [4])0x37d8ee,&exp,
                 (char (*) [2])0x365574);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    }
    goto LAB_002cc5bd;
  }
  if (iVar3 == 0) {
    __assert_fail("strcmp(op, \"atomic_compare_exchange_weak_explicit\") != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                  ,0x2669,
                  "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                 );
  }
  if (op1 != 0) {
    if (op1_is_literal == false) {
      CompilerGLSL::bitcast_expression_abi_cxx11_
                (&local_210,&this->super_CompilerGLSL,target_type,op1);
      puVar8 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,0x37aab7);
      psVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_230.field_2._M_allocated_capacity = *psVar10;
        local_230.field_2._8_8_ = puVar8[3];
        local_230._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_230.field_2._M_allocated_capacity = *psVar10;
        local_230._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_230._M_string_length = puVar8[1];
      *puVar8 = psVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      _Var12._M_p = local_210._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) goto LAB_002cc004;
    }
    else {
      join<char_const(&)[3],unsigned_int&>
                (&local_230,(spirv_cross *)0x37aab7,(char (*) [3])&op1,(uint *)(ulong)op1);
      ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
      _Var12._M_p = local_230._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
LAB_002cc004:
        operator_delete(_Var12._M_p);
      }
    }
  }
  if (id != 0) {
    CompilerGLSL::to_expression_abi_cxx11_(&local_210,&this->super_CompilerGLSL,id,true);
    puVar8 = (undefined8 *)::std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,0x37aab7)
    ;
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_230.field_2._M_allocated_capacity = *psVar10;
      local_230.field_2._8_8_ = puVar8[3];
      local_230._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_230.field_2._M_allocated_capacity = *psVar10;
      local_230._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_230._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,", ","");
  puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_210);
  psVar10 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_230.field_2._M_allocated_capacity = *psVar10;
    local_230.field_2._8_8_ = puVar8[3];
    local_230._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_230.field_2._M_allocated_capacity = *psVar10;
    local_230._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_230._M_string_length = puVar8[1];
  *puVar8 = psVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if (has_mem_order_2) {
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,", ","");
    puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_210);
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_230.field_2._M_allocated_capacity = *psVar10;
      local_230.field_2._8_8_ = puVar8[3];
      local_230._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_230.field_2._M_allocated_capacity = *psVar10;
      local_230._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_230._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
  }
  ::std::__cxx11::string::append((char *)&exp);
  if (bVar11) {
    ::std::__cxx11::string::append((char *)&exp);
    iVar3 = strcmp(op,"atomic_store_explicit");
    if (iVar3 != 0) {
      ::std::__cxx11::string::append((char *)&exp);
      ::std::__cxx11::string::append((char *)&exp);
      if ((pSVar6->storage == StorageClassUniformConstant) &&
         (*(int *)&(pSVar6->super_IVariant).field_0xc == 0x10)) {
        ::std::__cxx11::string::append((char *)&exp);
      }
      else {
        pSVar6 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(pSVar5->super_IVariant).field_0xc);
        get_type_address_space_abi_cxx11_
                  (&local_230,this,pSVar6,(pSVar5->super_IVariant).self.id,true);
        ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar1) {
          operator_delete(local_230._M_dataplus._M_p);
        }
      }
      ::std::__cxx11::string::append((char *)&exp);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_230,this,&remapped_type,0);
      ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)&exp);
      ::std::__cxx11::string::append((char *)&exp);
      CompilerGLSL::to_enclosed_expression_abi_cxx11_(&local_230,&this->super_CompilerGLSL,obj,true)
      ;
      ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      if (has_mem_order_2) {
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,", ","");
        puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_210);
        psVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_230.field_2._M_allocated_capacity = *psVar10;
          local_230.field_2._8_8_ = puVar8[3];
          local_230._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_230.field_2._M_allocated_capacity = *psVar10;
          local_230._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_230._M_string_length = puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar1) {
          operator_delete(local_230._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
LAB_002cc510:
          operator_delete(local_210._M_dataplus._M_p);
        }
      }
      else {
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,", ","");
        puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_210);
        psVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_230.field_2._M_allocated_capacity = *psVar10;
          local_230.field_2._8_8_ = puVar8[3];
          local_230._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_230.field_2._M_allocated_capacity = *psVar10;
          local_230._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_230._M_string_length = puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&exp,(ulong)local_230._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar1) {
          operator_delete(local_230._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) goto LAB_002cc510;
      }
    }
    ::std::__cxx11::string::append((char *)&exp);
    ::std::__cxx11::string::append((char *)&exp);
  }
  if (target_type != *(BaseType *)&(pSVar4->super_IVariant).field_0xc) {
    CompilerGLSL::bitcast_expression(&local_230,&this->super_CompilerGLSL,pSVar4,target_type,&exp);
    ::std::__cxx11::string::operator=((string *)&exp,(string *)&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
  }
  iVar3 = strcmp(op,"atomic_store_explicit");
  if (iVar3 == 0) {
    CompilerGLSL::statement<std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,&exp,(char (*) [2])0x365574);
  }
  else {
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,local_1ec,&exp,false,false);
  }
LAB_002cc5bd:
  Compiler::flush_all_atomic_capable_variables((Compiler *)this);
  remapped_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003fd210;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&remapped_type.member_name_cache._M_h);
  remapped_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      remapped_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
      &remapped_type.member_type_index_redirection.stack_storage) {
    free(remapped_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
  }
  remapped_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
  buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
      remapped_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
      != &remapped_type.member_types.stack_storage) {
    free(remapped_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
         ptr);
  }
  remapped_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  if ((AlignedBuffer<bool,_8UL> *)remapped_type.array_size_literal.super_VectorView<bool>.ptr !=
      &remapped_type.array_size_literal.stack_storage) {
    free(remapped_type.array_size_literal.super_VectorView<bool>.ptr);
  }
  remapped_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)remapped_type.array.super_VectorView<unsigned_int>.ptr !=
      &remapped_type.array.stack_storage) {
    free(remapped_type.array.super_VectorView<unsigned_int>.ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exp._M_dataplus._M_p != &exp.field_2) {
    operator_delete(exp._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerMSL::emit_atomic_func_op(uint32_t result_type, uint32_t result_id, const char *op, Op opcode,
                                      uint32_t mem_order_1, uint32_t mem_order_2, bool has_mem_order_2, uint32_t obj, uint32_t op1,
                                      bool op1_is_pointer, bool op1_is_literal, uint32_t op2)
{
	string exp;

	auto &type = get_pointee_type(expression_type(obj));
	auto expected_type = type.basetype;
	if (opcode == OpAtomicUMax || opcode == OpAtomicUMin)
		expected_type = to_unsigned_basetype(type.width);
	else if (opcode == OpAtomicSMax || opcode == OpAtomicSMin)
		expected_type = to_signed_basetype(type.width);

	if (type.width == 64)
		SPIRV_CROSS_THROW("MSL currently does not support 64-bit atomics.");

	auto remapped_type = type;
	remapped_type.basetype = expected_type;

	auto *var = maybe_get_backing_variable(obj);
	if (!var)
		SPIRV_CROSS_THROW("No backing variable for atomic operation.");
	const auto &res_type = get<SPIRType>(var->basetype);

	bool is_atomic_compare_exchange_strong = op1_is_pointer && op1;

	bool check_discard = opcode != OpAtomicLoad && needs_frag_discard_checks() &&
	                     ((res_type.storage == StorageClassUniformConstant && res_type.basetype == SPIRType::Image) ||
	                      var->storage == StorageClassStorageBuffer || var->storage == StorageClassUniform);

	if (check_discard)
	{
		if (is_atomic_compare_exchange_strong)
		{
			// We're already emitting a CAS loop here; a conditional won't hurt.
			emit_uninitialized_temporary_expression(result_type, result_id);
			statement("if (!", builtin_to_glsl(BuiltInHelperInvocation, StorageClassInput), ")");
			begin_scope();
		}
		else
			exp = join("(!", builtin_to_glsl(BuiltInHelperInvocation, StorageClassInput), " ? ");
	}

	exp += string(op) + "(";
	exp += "(";
	// Emulate texture2D atomic operations
	if (res_type.storage == StorageClassUniformConstant && res_type.basetype == SPIRType::Image)
	{
		exp += "device";
	}
	else
	{
		exp += get_argument_address_space(*var);
	}

	exp += " atomic_";
	// For signed and unsigned min/max, we can signal this through the pointer type.
	// There is no other way, since C++ does not have explicit signage for atomics.
	exp += type_to_glsl(remapped_type);
	exp += "*)";

	exp += "&";
	exp += to_enclosed_expression(obj);

	if (is_atomic_compare_exchange_strong)
	{
		assert(strcmp(op, "atomic_compare_exchange_weak_explicit") == 0);
		assert(op2);
		assert(has_mem_order_2);
		exp += ", &";
		exp += to_name(result_id);
		exp += ", ";
		exp += to_expression(op2);
		exp += ", ";
		exp += get_memory_order(mem_order_1);
		exp += ", ";
		exp += get_memory_order(mem_order_2);
		exp += ")";

		// MSL only supports the weak atomic compare exchange, so emit a CAS loop here.
		// The MSL function returns false if the atomic write fails OR the comparison test fails,
		// so we must validate that it wasn't the comparison test that failed before continuing
		// the CAS loop, otherwise it will loop infinitely, with the comparison test always failing.
		// The function updates the comparitor value from the memory value, so the additional
		// comparison test evaluates the memory value against the expected value.
		if (!check_discard)
			emit_uninitialized_temporary_expression(result_type, result_id);
		statement("do");
		begin_scope();
		statement(to_name(result_id), " = ", to_expression(op1), ";");
		end_scope_decl(join("while (!", exp, " && ", to_name(result_id), " == ", to_enclosed_expression(op1), ")"));
		if (check_discard)
		{
			end_scope();
			statement("else");
			begin_scope();
			exp = "atomic_load_explicit(";
			exp += "(";
			// Emulate texture2D atomic operations
			if (res_type.storage == StorageClassUniformConstant && res_type.basetype == SPIRType::Image)
				exp += "device";
			else
				exp += get_argument_address_space(*var);

			exp += " atomic_";
			exp += type_to_glsl(remapped_type);
			exp += "*)";

			exp += "&";
			exp += to_enclosed_expression(obj);

			if (has_mem_order_2)
				exp += string(", ") + get_memory_order(mem_order_2);
			else
				exp += string(", ") + get_memory_order(mem_order_1);

			exp += ")";

			statement(to_name(result_id), " = ", exp, ";");
			end_scope();
		}
	}
	else
	{
		assert(strcmp(op, "atomic_compare_exchange_weak_explicit") != 0);
		if (op1)
		{
			if (op1_is_literal)
				exp += join(", ", op1);
			else
				exp += ", " + bitcast_expression(expected_type, op1);
		}
		if (op2)
			exp += ", " + to_expression(op2);

		exp += string(", ") + get_memory_order(mem_order_1);
		if (has_mem_order_2)
			exp += string(", ") + get_memory_order(mem_order_2);

		exp += ")";

		if (check_discard)
		{
			exp += " : ";
			if (strcmp(op, "atomic_store_explicit") != 0)
			{
				exp += "atomic_load_explicit(";
				exp += "(";
				// Emulate texture2D atomic operations
				if (res_type.storage == StorageClassUniformConstant && res_type.basetype == SPIRType::Image)
					exp += "device";
				else
					exp += get_argument_address_space(*var);

				exp += " atomic_";
				exp += type_to_glsl(remapped_type);
				exp += "*)";

				exp += "&";
				exp += to_enclosed_expression(obj);

				if (has_mem_order_2)
					exp += string(", ") + get_memory_order(mem_order_2);
				else
					exp += string(", ") + get_memory_order(mem_order_1);

				exp += ")";
			}
			else
				exp += "((void)0)";
			exp += ")";
		}

		if (expected_type != type.basetype)
			exp = bitcast_expression(type, expected_type, exp);

		if (strcmp(op, "atomic_store_explicit") != 0)
			emit_op(result_type, result_id, exp, false);
		else
			statement(exp, ";");
	}

	flush_all_atomic_capable_variables();
}